

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O2

void google::protobuf::compiler::javanano::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,Params *params,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  ulong uVar1;
  int iVar2;
  string *src;
  FieldDescriptor *field;
  long lVar3;
  JavaType JVar4;
  CppType CVar5;
  Type TVar6;
  uint32 uVar7;
  FieldType type;
  uint uVar8;
  mapped_type *pmVar9;
  LogMessage *other;
  protobuf *this;
  FieldDescriptor *in_RCX;
  undefined1 *field_00;
  int i;
  JavaType type_00;
  JavaType type_01;
  JavaType type_02;
  uint i_00;
  uint i_01;
  int i_02;
  FieldDescriptor *field_01;
  unsigned_long i_03;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  SubstituteArg *this_00;
  ulong uVar10;
  SubstituteArg *in_stack_fffffffffffffd78;
  allocator<char> local_279;
  SubstituteArg local_278;
  LogMessage local_248;
  SubstituteArg local_210;
  key_type local_1e0;
  SubstituteArg local_1c0;
  string local_190;
  string local_170;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  UnderscoresToCamelCase_abi_cxx11_
            ((string *)&local_278,(javanano *)descriptor,(FieldDescriptor *)variables);
  RenameJavaKeywords((string *)(&local_278 + 1),(string *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"name",(allocator<char> *)&local_1c0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_210);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  UnderscoresToCapitalizedCamelCase_abi_cxx11_((string *)&local_278,(javanano *)descriptor,field_01)
  ;
  RenameJavaKeywords((string *)(&local_278 + 1),(string *)&local_278);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"capitalized_name",(allocator<char> *)&local_1c0);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_210);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  SimpleItoa_abi_cxx11_
            ((string *)(&local_278 + 1),(protobuf *)(ulong)*(uint *)(descriptor + 0x38),i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"number",(allocator<char> *)&local_210);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_278);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  if ((params->use_reference_types_for_primitives_ == true) && (*(int *)(descriptor + 0x4c) != 3)) {
    JVar4 = GetJavaType(descriptor);
    BoxedPrimitiveTypeName_abi_cxx11_((string *)(&local_278 + 1),(javanano *)(ulong)JVar4,type_01);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"type",(allocator<char> *)&local_210);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_278);
  }
  else {
    JVar4 = GetJavaType(descriptor);
    PrimitiveTypeName_abi_cxx11_((string *)(&local_278 + 1),(javanano *)(ulong)JVar4,type_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"type",(allocator<char> *)&local_210);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_278);
  }
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  CVar5 = FieldDescriptor::cpp_type(descriptor);
  if (((CVar5 == CPPTYPE_STRING) && (*(long *)(*(long *)(descriptor + 0xa0) + 8) != 0)) &&
     (params->use_reference_types_for_primitives_ == false)) {
    TVar6 = FieldDescriptor::type(descriptor);
    if (TVar6 == TYPE_BYTES) {
      DefaultValue_abi_cxx11_
                ((string *)(&local_278 + 1),(javanano *)params,(Params *)descriptor,in_RCX);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"default",(allocator<char> *)&local_210);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_278);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)(&local_278 + 1));
      FieldDefaultConstantName_abi_cxx11_
                ((string *)(&local_278 + 1),(javanano *)descriptor,field_02);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"default_constant",(allocator<char> *)&local_210);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_278);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)(&local_278 + 1));
      CEscape(&local_190,*(string **)(descriptor + 0xa0));
      local_278.text_ = (char *)0x0;
      local_278.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_1c0.text_ = (char *)0x0;
      local_1c0.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_248._0_8_ = local_190._M_dataplus._M_p;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_248.filename_._0_4_ = (undefined4)local_190._M_string_length;
      local_120.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_170,
                 (strings *)"com.google.protobuf.nano.InternalNano.bytesDefaultValue(\"$0\")",
                 (char *)(&local_278 + 1),&local_278,&local_210,&local_1c0,&local_150,&local_60,
                 &local_90,&local_c0,&local_f0,&local_120,in_stack_fffffffffffffd78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"default_constant_value",&local_279);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_1e0);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"default",(allocator<char> *)&local_1c0);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_278);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (&local_278 + 1),pmVar9,".clone()");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"default_copy_if_needed",(allocator<char> *)&local_150);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_210);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)(&local_278 + 1));
      this_00 = &local_278;
      goto LAB_002bc1b6;
    }
    src = *(string **)(descriptor + 0xa0);
    field = (FieldDescriptor *)(src->_M_dataplus)._M_p;
    uVar10 = 0xffffffffffffffff;
    do {
      if (uVar10 - src->_M_string_length == -1) goto LAB_002bc9fc;
      uVar1 = uVar10 + 1;
      lVar3 = uVar10 + 1;
      uVar10 = uVar1;
    } while (-1 < (char)field[lVar3]);
    if (uVar1 < src->_M_string_length) {
      DefaultValue_abi_cxx11_
                ((string *)(&local_278 + 1),(javanano *)params,(Params *)descriptor,field);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"default",(allocator<char> *)&local_210);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_278);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)(&local_278 + 1));
      FieldDefaultConstantName_abi_cxx11_
                ((string *)(&local_278 + 1),(javanano *)descriptor,field_03);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"default_constant",(allocator<char> *)&local_210);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_278);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)(&local_278 + 1));
      CEscape(&local_190,*(string **)(descriptor + 0xa0));
      local_278.text_ = (char *)0x0;
      local_278.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_1c0.text_ = (char *)0x0;
      local_1c0.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_248._0_8_ = local_190._M_dataplus._M_p;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_248.filename_._0_4_ = (undefined4)local_190._M_string_length;
      local_120.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_170,
                 (strings *)"com.google.protobuf.nano.InternalNano.stringDefaultValue(\"$0\")",
                 (char *)(&local_278 + 1),&local_278,&local_210,&local_1c0,&local_150,&local_60,
                 &local_90,&local_c0,&local_f0,&local_120,in_stack_fffffffffffffd78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"default_constant_value",&local_279);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,&local_1e0);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(&local_278 + 1),"default",(allocator<char> *)&local_210);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](variables,(key_type *)(&local_278 + 1));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"default_copy_if_needed",(allocator<char> *)&local_1c0);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_278);
      std::__cxx11::string::_M_assign((string *)pmVar9);
    }
    else {
LAB_002bc9fc:
      CEscape((string *)&local_210,src);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278
                     ,"\"",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_210);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (&local_278 + 1),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278
                     ,"\"");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c0,"default",(allocator<char> *)&local_150);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_1c0);
      std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)(&local_278 + 1));
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(&local_278 + 1),"default",(allocator<char> *)&local_210);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](variables,(key_type *)(&local_278 + 1));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"default_copy_if_needed",(allocator<char> *)&local_1c0);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](variables,(key_type *)&local_278);
      std::__cxx11::string::_M_assign((string *)pmVar9);
    }
  }
  else {
    DefaultValue_abi_cxx11_
              ((string *)(&local_278 + 1),(javanano *)params,(Params *)descriptor,in_RCX);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"default",(allocator<char> *)&local_210);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_278);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)(&local_278 + 1));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(&local_278 + 1),"default",(allocator<char> *)&local_210);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](variables,(key_type *)(&local_278 + 1));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"default_copy_if_needed",(allocator<char> *)&local_1c0);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_278);
    std::__cxx11::string::_M_assign((string *)pmVar9);
  }
  std::__cxx11::string::~string((string *)&local_278);
  this_00 = &local_278 + 1;
LAB_002bc1b6:
  std::__cxx11::string::~string((string *)this_00);
  JVar4 = GetJavaType(descriptor);
  BoxedPrimitiveTypeName_abi_cxx11_((string *)(&local_278 + 1),(javanano *)(ulong)JVar4,type_02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"boxed_type",(allocator<char> *)&local_210);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_278);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  TVar6 = FieldDescriptor::type(descriptor);
  if (0x11 < TVar6 - TYPE_DOUBLE) {
    internal::LogMessage::LogMessage
              ((LogMessage *)(&local_278 + 1),LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_primitive_field.cc"
               ,0x7a);
    other = internal::LogMessage::operator<<((LogMessage *)(&local_278 + 1),"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_278,other);
    internal::LogMessage::~LogMessage((LogMessage *)(&local_278 + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(&local_278 + 1),"capitalized_type",(allocator<char> *)&local_278);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)(&local_278 + 1));
  std::__cxx11::string::assign((char *)pmVar9);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  uVar7 = internal::WireFormat::MakeTag(descriptor);
  SimpleItoa_abi_cxx11_((string *)(&local_278 + 1),(protobuf *)(ulong)uVar7,i_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"tag",(allocator<char> *)&local_210);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_278);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  iVar2 = *(int *)(descriptor + 0x38);
  type = FieldDescriptor::type(descriptor);
  this = (protobuf *)internal::WireFormatLite::TagSize(iVar2,type);
  SimpleItoa_abi_cxx11_((string *)(&local_278 + 1),this,i_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"tag_size",(allocator<char> *)&local_210);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_278);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  iVar2 = *(int *)(descriptor + 0x38);
  TVar6 = FieldDescriptor::type(descriptor);
  field_00 = internal::WireFormatLite::kWireTypeForFieldType;
  SimpleItoa_abi_cxx11_
            ((string *)(&local_278 + 1),
             (protobuf *)
             (ulong)(iVar2 << 3 |
                    *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar6 * 4)),
             i_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"non_packed_tag",(allocator<char> *)&local_210);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_278);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  TVar6 = FieldDescriptor::type(descriptor);
  uVar8 = FixedSize(TVar6);
  if (uVar8 != 0xffffffff) {
    SimpleItoa_abi_cxx11_((string *)(&local_278 + 1),(protobuf *)(ulong)uVar8,i_02);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"fixed_size",(allocator<char> *)&local_210);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_278);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)(&local_278 + 1));
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(&local_278 + 1),"message_name",(allocator<char> *)&local_278);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)(&local_278 + 1));
  std::__cxx11::string::_M_assign((string *)pmVar9);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  EmptyArrayName_abi_cxx11_
            ((string *)(&local_278 + 1),(javanano *)params,(Params *)descriptor,
             (FieldDescriptor *)field_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"empty_array_name",(allocator<char> *)&local_210);
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_278);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)(&local_278 + 1));
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)(&local_278 + 1));
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor, const Params params,
                           map<string, string>* variables) {
  (*variables)["name"] =
    RenameJavaKeywords(UnderscoresToCamelCase(descriptor));
  (*variables)["capitalized_name"] =
    RenameJavaKeywords(UnderscoresToCapitalizedCamelCase(descriptor));
  (*variables)["number"] = SimpleItoa(descriptor->number());
  if (params.use_reference_types_for_primitives()
      && !descriptor->is_repeated()) {
    (*variables)["type"] = BoxedPrimitiveTypeName(GetJavaType(descriptor));
  } else {
    (*variables)["type"] = PrimitiveTypeName(GetJavaType(descriptor));
  }
  // Deals with defaults. For C++-string types (string and bytes),
  // we might need to have the generated code do the unicode decoding
  // (see comments in InternalNano.java for gory details.). We would
  // like to do this once into a static field and re-use that from
  // then on.
  if (descriptor->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
      !descriptor->default_value_string().empty() &&
      !params.use_reference_types_for_primitives()) {
    if (descriptor->type() == FieldDescriptor::TYPE_BYTES) {
      (*variables)["default"] = DefaultValue(params, descriptor);
      (*variables)["default_constant"] = FieldDefaultConstantName(descriptor);
      (*variables)["default_constant_value"] = strings::Substitute(
          "com.google.protobuf.nano.InternalNano.bytesDefaultValue(\"$0\")",
          CEscape(descriptor->default_value_string()));
      (*variables)["default_copy_if_needed"] =
          (*variables)["default"] + ".clone()";
    } else if (AllAscii(descriptor->default_value_string())) {
      // All chars are ASCII.  In this case directly referencing a
      // CEscape()'d string literal works fine.
      (*variables)["default"] =
          "\"" + CEscape(descriptor->default_value_string()) + "\"";
      (*variables)["default_copy_if_needed"] = (*variables)["default"];
    } else {
      // Strings where some chars are non-ASCII. We need to save the
      // default value.
      (*variables)["default"] = DefaultValue(params, descriptor);
      (*variables)["default_constant"] = FieldDefaultConstantName(descriptor);
      (*variables)["default_constant_value"] = strings::Substitute(
          "com.google.protobuf.nano.InternalNano.stringDefaultValue(\"$0\")",
          CEscape(descriptor->default_value_string()));
      (*variables)["default_copy_if_needed"] = (*variables)["default"];
    }
  } else {
    // Non-string, non-bytes field. Defaults are literals.
    (*variables)["default"] = DefaultValue(params, descriptor);
    (*variables)["default_copy_if_needed"] = (*variables)["default"];
  }
  (*variables)["boxed_type"] = BoxedPrimitiveTypeName(GetJavaType(descriptor));
  (*variables)["capitalized_type"] = GetCapitalizedType(descriptor);
  (*variables)["tag"] = SimpleItoa(WireFormat::MakeTag(descriptor));
  (*variables)["tag_size"] = SimpleItoa(
      WireFormat::TagSize(descriptor->number(), descriptor->type()));
  (*variables)["non_packed_tag"] = SimpleItoa(
      internal::WireFormatLite::MakeTag(descriptor->number(),
          internal::WireFormat::WireTypeForFieldType(descriptor->type())));
  int fixed_size = FixedSize(descriptor->type());
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = SimpleItoa(fixed_size);
  }
  (*variables)["message_name"] = descriptor->containing_type()->name();
  (*variables)["empty_array_name"] = EmptyArrayName(params, descriptor);
}